

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureDataManager.cpp
# Opt level: O0

void __thiscall SecureDataManager::initObject(SecureDataManager *this)

{
  int iVar1;
  CryptoFactory *pCVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CK_UNLOCKMUTEX p_Var3;
  Mutex *pMVar4;
  MutexFactory *in_RDI;
  char *in_stack_00000058;
  ByteString *in_stack_ffffffffffffff98;
  ByteString *this_00;
  ByteString local_40;
  
  pCVar2 = CryptoFactory::i();
  iVar1 = (*pCVar2->_vptr_CryptoFactory[8])();
  *(ulong *)&in_RDI[3].enabled = CONCAT44(extraout_var,iVar1);
  pCVar2 = CryptoFactory::i();
  iVar1 = (**pCVar2->_vptr_CryptoFactory)(pCVar2,1);
  in_RDI[4]._vptr_MutexFactory = (_func_int **)CONCAT44(extraout_var_00,iVar1);
  p_Var3 = (CK_UNLOCKMUTEX)operator_new(0x28);
  ByteString::ByteString((ByteString *)0x1c7b59);
  in_RDI[3].unlockMutex = p_Var3;
  (**(code **)(**(long **)&in_RDI[3].enabled + 0x10))
            (*(long **)&in_RDI[3].enabled,in_RDI[3].unlockMutex,0x20);
  in_RDI[1].field_0x29 = 0;
  in_RDI[1].enabled = false;
  this_00 = &local_40;
  ByteString::ByteString((ByteString *)this,in_stack_00000058);
  ByteString::operator=(this_00,in_stack_ffffffffffffff98);
  ByteString::~ByteString((ByteString *)0x1c7bcd);
  MutexFactory::i();
  pMVar4 = MutexFactory::getMutex(in_RDI);
  in_RDI[4].createMutex = (CK_CREATEMUTEX)pMVar4;
  return;
}

Assistant:

void SecureDataManager::initObject()
{
	// Get an RNG instance
	rng = CryptoFactory::i()->getRNG();

	// Get an AES implementation
	aes = CryptoFactory::i()->getSymmetricAlgorithm(SymAlgo::AES);

	// Initialise masking data
	mask = new ByteString();

	rng->generateRandom(*mask, 32);

	// Set the initial login state
	soLoggedIn = userLoggedIn = false;

	// Set the magic
	magic = ByteString("524A52"); // RJR

	// Get a mutex
	dataMgrMutex = MutexFactory::i()->getMutex();
}